

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall re2::Prog::Optimize(Prog *this)

{
  Inst *pIVar1;
  uint uVar2;
  Inst *pIVar3;
  Inst *pIVar4;
  uint uVar5;
  ulong uVar6;
  Inst *pIVar7;
  Inst *pIVar8;
  uint uVar9;
  _Head_base<0UL,_int_*,_false> _Var10;
  bool bVar11;
  Workq q;
  SparseSetT<void> local_58;
  
  SparseSetT<void>::SparseSetT(&local_58,this->size_);
  local_58.size_ = 0;
  if (this->start_ != 0) {
    SparseSetT<void>::InsertInternal(&local_58,true,this->start_);
  }
  _Var10._M_head_impl =
       local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (local_58.size_ != 0) {
    do {
      uVar2 = *_Var10._M_head_impl;
      pIVar3 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      uVar5 = pIVar3[(int)uVar2].out_opcode_;
      do {
        uVar9 = uVar5;
        if (uVar9 < 0x10) break;
        uVar5 = pIVar3[uVar9 >> 4].out_opcode_;
      } while ((pIVar3[uVar9 >> 4].out_opcode_ & 7) == 6);
      pIVar3[(int)uVar2].out_opcode_ = pIVar3[(int)uVar2].out_opcode_ & 0xf | uVar9 & 0xfffffff0;
      if (0xf < uVar9) {
        SparseSetT<void>::InsertInternal(&local_58,true,uVar9 >> 4);
      }
      if ((pIVar3[(int)uVar2].out_opcode_ & 7) == 0) {
        uVar5 = pIVar3[(int)uVar2].field_1.cap_;
        uVar6 = (ulong)(int)uVar5;
        bVar11 = uVar6 == 0;
        if (bVar11) {
LAB_001be526:
          pIVar3[(int)uVar2].field_1.cap_ = uVar5;
        }
        else {
          pIVar7 = (this->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
          uVar9 = pIVar7[uVar6].out_opcode_;
          while ((uVar9 & 7) == 6) {
            uVar5 = uVar9 >> 4;
            uVar6 = (ulong)uVar5;
            bVar11 = uVar9 < 0x10;
            if (bVar11) goto LAB_001be526;
            uVar9 = pIVar7[uVar5].out_opcode_;
          }
          pIVar3[(int)uVar2].field_1.cap_ = (int)uVar6;
          if (!bVar11) {
            SparseSetT<void>::InsertInternal(&local_58,true,(int)uVar6);
          }
        }
      }
      _Var10._M_head_impl = _Var10._M_head_impl + 1;
    } while (_Var10._M_head_impl !=
             local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl + local_58.size_);
  }
  local_58.size_ = 0;
  if (this->start_ != 0) {
    SparseSetT<void>::InsertInternal(&local_58,true,this->start_);
  }
  _Var10._M_head_impl =
       local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (local_58.size_ != 0) {
    do {
      uVar2 = *_Var10._M_head_impl;
      pIVar3 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      if (0xf < pIVar3[(int)uVar2].out_opcode_) {
        SparseSetT<void>::InsertInternal(&local_58,true,pIVar3[(int)uVar2].out_opcode_ >> 4);
      }
      if (((pIVar3[(int)uVar2].out_opcode_ & 7) == 0) && (pIVar3[(int)uVar2].field_1.cap_ != 0)) {
        SparseSetT<void>::InsertInternal(&local_58,true,pIVar3[(int)uVar2].field_1.cap_);
      }
      uVar5 = pIVar3[(int)uVar2].out_opcode_;
      if ((uVar5 & 7) == 0) {
        pIVar4 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        pIVar7 = pIVar4 + (uVar5 >> 4);
        pIVar1 = pIVar4 + pIVar3[(int)uVar2].field_1.cap_;
        if (((((pIVar7->out_opcode_ & 7) == 2) && (pIVar7->out_opcode_ >> 4 == uVar2)) &&
            ((pIVar7->field_1).field_3.lo_ == '\0')) &&
           (pIVar8 = pIVar1, (pIVar7->field_1).field_3.hi_ == 0xff)) {
          while( true ) {
            uVar9 = pIVar8->out_opcode_ & 7;
            if ((0x48U >> uVar9 & 1) == 0) break;
            pIVar8 = pIVar4 + (pIVar8->out_opcode_ >> 4);
          }
          if ((0x97U >> uVar9 & 1) != 0) goto LAB_001be63b;
        }
        else {
LAB_001be63b:
          while( true ) {
            uVar9 = pIVar7->out_opcode_ & 7;
            if ((0x48U >> uVar9 & 1) == 0) break;
            pIVar7 = pIVar4 + (pIVar7->out_opcode_ >> 4);
          }
          if ((((0x97U >> uVar9 & 1) != 0) || ((pIVar1->out_opcode_ & 7) != 2)) ||
             ((pIVar1->out_opcode_ >> 4 != uVar2 ||
              (((pIVar1->field_1).field_3.lo_ != '\0' || ((pIVar1->field_1).field_3.hi_ != 0xff)))))
             ) goto LAB_001be651;
        }
        pIVar3[(int)uVar2].out_opcode_ = uVar5 | 1;
      }
LAB_001be651:
      _Var10._M_head_impl = _Var10._M_head_impl + 1;
    } while (_Var10._M_head_impl !=
             local_58.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl + local_58.size_);
  }
  SparseSetT<void>::~SparseSetT(&local_58);
  return;
}

Assistant:

void Prog::Optimize() {
  Workq q(size_);

  // Eliminate nops.  Most are taken out during compilation
  // but a few are hard to avoid.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;

    Inst* ip = inst(id);
    int j = ip->out();
    Inst* jp;
    while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
      j = jp->out();
    }
    ip->set_out(j);
    AddToQueue(&q, ip->out());

    if (ip->opcode() == kInstAlt) {
      j = ip->out1();
      while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
        j = jp->out();
      }
      ip->out1_ = j;
      AddToQueue(&q, ip->out1());
    }
  }

  // Insert kInstAltMatch instructions
  // Look for
  //   ip: Alt -> j | k
  //	  j: ByteRange [00-FF] -> ip
  //    k: Match
  // or the reverse (the above is the greedy one).
  // Rewrite Alt to AltMatch.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;
    Inst* ip = inst(id);
    AddToQueue(&q, ip->out());
    if (ip->opcode() == kInstAlt)
      AddToQueue(&q, ip->out1());

    if (ip->opcode() == kInstAlt) {
      Inst* j = inst(ip->out());
      Inst* k = inst(ip->out1());
      if (j->opcode() == kInstByteRange && j->out() == id &&
          j->lo() == 0x00 && j->hi() == 0xFF &&
          IsMatch(this, k)) {
        ip->set_opcode(kInstAltMatch);
        continue;
      }
      if (IsMatch(this, j) &&
          k->opcode() == kInstByteRange && k->out() == id &&
          k->lo() == 0x00 && k->hi() == 0xFF) {
        ip->set_opcode(kInstAltMatch);
      }
    }
  }
}